

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O2

void __thiscall TestClass::ProcessFunc3(TestClass *this,Event3 *ev)

{
  timeval curTime;
  timeval local_10;
  
  TimeUtils::getCurTime(&local_10);
  return;
}

Assistant:

void TestClass::ProcessFunc3( Event3 *ev )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	struct timeval curTime;
	TimeUtils::getCurTime( &curTime );
	
	int elapsed = TimeUtils::getDifference( &curTime, &ev->mSent );
	LOG_NOTICE( "Timer %p with tick time %d, elapsed is %d\n",
				ev->mTimer, ev->mTimer->getTickTime(), elapsed );
}